

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

int Wlc_NtkMemAbstract(Wlc_Ntk_t *p,int nIterMax,int fDumpAbs,int fPdrVerbose,int fVerbose)

{
  char cVar1;
  void *__ptr;
  Vec_Int_t *__ptr_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Wec_t *vConstrs;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Wlc_Ntk_t *pWVar8;
  char *pcVar9;
  Gia_Man_t *pGVar10;
  Aig_Man_t *pAVar11;
  Aig_Man_t *p_00;
  Vec_Wrd_t *vValues;
  ulong uVar12;
  long lVar13;
  int Count;
  int level;
  long lVar14;
  Abc_Cex_t *pCex;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  timespec ts;
  Abc_Cex_t *local_158;
  ulong local_150;
  uint local_144;
  Wlc_Ntk_t *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  Vec_Int_t *local_128;
  long local_120;
  int local_114;
  Vec_Int_t *local_110;
  Vec_Int_t *local_108;
  Gia_Man_t *local_100;
  Vec_Int_t *local_f8;
  Pdr_Par_t local_f0;
  
  local_144 = nIterMax;
  local_140 = p;
  local_114 = fDumpAbs;
  iVar2 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar2 < 0) {
    local_120 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_f0._8_8_),8);
    local_120 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_f0._0_8_ * -1000000;
  }
  local_158 = (Abc_Cex_t *)0x0;
  vConstrs = (Vec_Wec_t *)malloc(0x10);
  vConstrs->nCap = 100;
  vConstrs->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(100,0x10);
  vConstrs->pArray = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pWVar8 = local_140;
  pVVar5->pArray = piVar6;
  iVar2 = 0;
  pVVar7 = Wlc_NtkCollectMemory(local_140,0);
  local_110 = Wlc_NtkCollectMemFanins(pWVar8,pVVar7);
  local_128 = pVVar7;
  pWVar8 = Wlc_NtkAbstractMemory
                     (pWVar8,pVVar7,local_110,&local_12c,&local_130,&local_134,(Vec_Wec_t *)0x0,
                      (Vec_Int_t *)0x0);
  pcVar9 = pWVar8->pInits;
  do {
    cVar1 = *pcVar9;
    uVar3 = 1;
    if (cVar1 != 'x') {
      if (cVar1 == '\0') break;
      uVar3 = (uint)(cVar1 == 'X');
    }
    iVar2 = iVar2 + uVar3;
    pcVar9 = pcVar9 + 1;
  } while( true );
  local_f8 = Wlc_NtkDeriveFirstTotal
                       (local_140,local_128,local_110,local_12c,local_134 + iVar2,fVerbose);
  local_150 = 0;
  local_100 = Wlc_NtkBitBlast(pWVar8,(Wlc_BstPar_t *)0x0);
  if (local_100->vCis->nSize - local_100->nRegs != iVar2 + local_130) {
    __assert_fail("Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                  ,0x3ec,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
  }
  Wlc_NtkFree(pWVar8);
  if ((int)local_144 < 1) {
    local_138 = -1;
  }
  else {
    local_150 = 0;
    local_108 = pVVar5;
    do {
      Pdr_ManSetDefaultParams(&local_f0);
      local_f0.fUseAbs = 0;
      local_f0.fVerbose = fVerbose;
      pWVar8 = Wlc_NtkAbstractMemory
                         (local_140,local_128,(Vec_Int_t *)0x0,&local_12c,&local_130,&local_134,
                          vConstrs,pVVar5);
      pGVar10 = Wlc_NtkBitBlast(pWVar8,(Wlc_BstPar_t *)0x0);
      pAVar11 = Gia_ManToAigSimple(pGVar10);
      Gia_ManStop(pGVar10);
      pAVar11->nConstrs = 1;
      p_00 = Saig_ManDupFoldConstrsFunc(pAVar11,0,0);
      Aig_ManStop(pAVar11);
      pGVar10 = Gia_ManFromAigSimple(p_00);
      Aig_ManStop(p_00);
      pAVar11 = Gia_ManToAigSimple(pGVar10);
      iVar2 = Pdr_ManSolve(pAVar11,&local_f0);
      local_158 = pAVar11->pSeqModel;
      pAVar11->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(pAVar11);
      if (fVerbose != 0) {
        pcVar9 = "\nITERATIONS %d:\n";
        printf("\nITERATIONS %d:\n",local_150);
        Wlc_NtkPrintCex((Wlc_Ntk_t *)pcVar9,pWVar8,local_158);
      }
      Wlc_NtkFree(pWVar8);
      if (local_114 != 0) {
        Gia_AigerWrite(pGVar10,"mem_abs.aig",0,0,0);
        if (local_158 == (Abc_Cex_t *)0x0) {
          uVar12 = 0xffffffff;
        }
        else {
          uVar12 = (ulong)(uint)local_158->iFrame;
        }
        printf("Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n",
               local_150,"mem_abs.aig",uVar12);
      }
      local_138 = iVar2;
      if (local_158 == (Abc_Cex_t *)0x0) {
        if (iVar2 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                        ,0x41e,"int Wlc_NtkMemAbstract(Wlc_Ntk_t *, int, int, int, int)");
        }
        Gia_ManStop(pGVar10);
        pVVar5 = local_108;
        goto LAB_0033bc3e;
      }
      vValues = Wlc_NtkConvertCex(local_f8,local_100,local_158,fVerbose);
      Gia_ManStop(pGVar10);
      pVVar7 = Wlc_NtkFindConflict(local_140,local_128,vValues,local_158->iFrame + 1);
      if (vValues->pArray != (word *)0x0) {
        free(vValues->pArray);
        vValues->pArray = (word *)0x0;
      }
      if (vValues != (Vec_Wrd_t *)0x0) {
        free(vValues);
      }
      pVVar5 = local_108;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0033bc3e;
      Abc_CexFreeP(&local_158);
      if (fVerbose != 0) {
        Wlc_NtkPrintConflict(local_140,pVVar7);
      }
      Vec_WecPushLevel(vConstrs);
      iVar2 = vConstrs->nSize;
      if ((long)iVar2 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
      }
      if (0 < pVVar7->nSize) {
        pVVar5 = vConstrs->pArray;
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar5 + (long)iVar2 + -1,pVVar7->pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar7->nSize);
      }
      pVVar5 = local_108;
      Wlc_NtkAbsAddToNodeFrames(local_108,pVVar7);
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (int *)0x0;
      }
      free(pVVar7);
      uVar3 = (int)local_150 + 1;
      local_150 = (ulong)uVar3;
    } while (uVar3 != local_144);
    local_150 = (ulong)local_144;
  }
LAB_0033bc3e:
  Gia_ManStop(local_100);
  if (0 < vConstrs->nCap) {
    lVar13 = 8;
    lVar14 = 0;
    do {
      __ptr = *(void **)((long)&vConstrs->pArray->nCap + lVar13);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&vConstrs->pArray->nCap + lVar13) = 0;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar14 < vConstrs->nCap);
  }
  if (vConstrs->pArray != (Vec_Int_t *)0x0) {
    free(vConstrs->pArray);
    vConstrs->pArray = (Vec_Int_t *)0x0;
  }
  vConstrs->nCap = 0;
  vConstrs->nSize = 0;
  free(vConstrs);
  __ptr_00 = local_110;
  pVVar7 = local_128;
  if (local_128 != (Vec_Int_t *)0x0) {
    if (local_128->pArray != (int *)0x0) {
      free(local_128->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    free(pVVar7);
  }
  pVVar7 = local_f8;
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (int *)0x0;
    }
    free(__ptr_00);
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    free(pVVar7);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  free(pVVar5);
  if (fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  iVar2 = local_138;
  if (local_158 == (Abc_Cex_t *)0x0 || local_138 != 0) {
    if (local_138 == 1) {
      pcVar9 = "is successfully proved";
    }
    else {
      pcVar9 = "timed out";
    }
    printf(pcVar9);
  }
  else {
    printf("resulted in a real CEX in frame %d",(ulong)(uint)local_158->iFrame);
  }
  printf(" after %d iterations. ",local_150);
  level = 3;
  iVar4 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = (long)local_f0._8_8_ / 1000 + local_f0._0_8_ * 1000000;
  }
  lVar13 = lVar13 + local_120;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",SUB84((double)lVar13 / 1000000.0,0));
  Abc_CexFreeP(&local_158);
  return iVar2;
}

Assistant:

int Wlc_NtkMemAbstract( Wlc_Ntk_t * p, int nIterMax, int fDumpAbs, int fPdrVerbose, int fVerbose )
{
    abctime clk = Abc_Clock();
    Wlc_Ntk_t * pNewFull, * pNew; Aig_Man_t * pAig, * pTempAig;
    Gia_Man_t * pAbsFull, * pAbs;
    Abc_Cex_t * pCex = NULL;  Vec_Wrd_t * vValues = NULL; 
    Vec_Wec_t * vRefines = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Vec_Int_t * vMemObjs, * vMemFanins, * vFirstTotal, * vRefine; 
    int RetValue = -1, iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits, nIters;

    vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    vFirstTotal = Wlc_NtkDeriveFirstTotal( p, vMemObjs, vMemFanins, iFirstMemPi, nDcBits + iFirstMemCi, fVerbose );

    pAbsFull    = Wlc_NtkBitBlast( pNewFull, NULL );
    assert( Gia_ManPiNum(pAbsFull) == iFirstCi + nDcBits );
    Wlc_NtkFree( pNewFull );

    // perform abstraction
    for ( nIters = 0; nIters < nIterMax; nIters++ )
    {
        // set up parameters to run PDR
        Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
        Pdr_ManSetDefaultParams( pPdrPars );
        pPdrPars->fUseAbs    = 0;   // use 'pdr -t'  (on-the-fly abstraction)
        pPdrPars->fVerbose   = fVerbose;

        // derive specific abstraction
        pNew = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );
        pAbs = Wlc_NtkBitBlast( pNew, NULL );
        // simplify the AIG
        //pAbs = Gia_ManSeqStructSweep( pGiaTemp = pAbs, 1, 1, 0 );
        //Gia_ManStop( pGiaTemp );

        // roll in the constraints
        pAig = Gia_ManToAigSimple( pAbs );
        Gia_ManStop( pAbs );
        pAig->nConstrs = 1;
        pAig = Saig_ManDupFoldConstrsFunc( pTempAig = pAig, 0, 0 );
        Aig_ManStop( pTempAig );
        pAbs = Gia_ManFromAigSimple( pAig );
        Aig_ManStop( pAig );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pAbs );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        if ( fVerbose )
            printf( "\nITERATIONS %d:\n", nIters );
        if ( fVerbose )
            Wlc_NtkPrintCex( p, pNew, pCex );
        Wlc_NtkFree( pNew );

        if ( fDumpAbs )
        {
            char * pFileName = "mem_abs.aig";
            Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
            printf( "Iteration %3d: Dumped abstraction in file \"%s\" after finding CEX in frame %d.\n", nIters, pFileName, pCex ? pCex->iFrame : -1 );
        }

        // check if proved or undecided
        if ( pCex == NULL ) 
        {
            assert( RetValue );
            Gia_ManStop( pAbs );
            break;
        }

        // analyze counter-example
        vValues = Wlc_NtkConvertCex( vFirstTotal, pAbsFull, pCex, fVerbose );
        Gia_ManStop( pAbs );
        vRefine = Wlc_NtkFindConflict( p, vMemObjs, vValues, pCex->iFrame + 1 );
        Vec_WrdFree( vValues );
        if ( vRefine == NULL ) // cannot refine
            break;
        Abc_CexFreeP( &pCex );

        // save refinement for the future
        if ( fVerbose )
            Wlc_NtkPrintConflict( p, vRefine );
        Vec_WecPushLevel( vRefines );
        Vec_IntAppend( Vec_WecEntryLast(vRefines), vRefine );
        Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );
        Vec_IntFree( vRefine );
    }
    // cleanup
    Gia_ManStop( pAbsFull );
    Vec_WecFree( vRefines );
    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    Vec_IntFreeP( &vFirstTotal );
    Vec_IntFreeP( &vNodeFrames );

    // report the result
    if ( fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 && pCex )
        printf( "resulted in a real CEX in frame %d", pCex->iFrame );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_CexFreeP( &pCex ); // return CEX in the future
    return RetValue;
}